

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgParticleSwarm.hpp
# Opt level: O0

void __thiscall
TasOptimization::ParticleSwarmState::setParticlePositions
          (ParticleSwarmState *this,vector<double,_std::allocator<double>_> *pp)

{
  size_type sVar1;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  vector<double,_std::allocator<double>_> *local_18;
  vector<double,_std::allocator<double>_> *pp_local;
  ParticleSwarmState *this_local;
  
  local_18 = pp;
  pp_local = (vector<double,_std::allocator<double>_> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"ParticleSwarmState::setParticlePositions",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"particle position",&local_71);
  sVar1 = std::vector<double,_std::allocator<double>_>::size(local_18);
  checkVarSize(&local_38,&local_70,(int)sVar1,this->num_dimensions * this->num_particles);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  std::vector<double,_std::allocator<double>_>::operator=(&this->particle_positions,local_18);
  this->positions_initialized = true;
  return;
}

Assistant:

void setParticlePositions(const std::vector<double> &pp) {
        checkVarSize("ParticleSwarmState::setParticlePositions", "particle position", pp.size(), num_dimensions * num_particles);
        particle_positions = pp;
        positions_initialized = true;
    }